

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.hh
# Opt level: O3

uintb __thiscall EmulateFunction::getVarnodeValue(EmulateFunction *this,Varnode *vn)

{
  _Rb_tree_header *p_Var1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  _Base_ptr p_Var3;
  undefined4 extraout_var;
  _Base_ptr p_Var4;
  
  if ((vn->flags & 2) != 0) {
    return (vn->loc).offset;
  }
  p_Var4 = (this->varnodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->varnodeMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (*(Varnode **)(p_Var4 + 1) >= vn) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(Varnode **)(p_Var4 + 1) < vn];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (*(Varnode **)(p_Var3 + 1) <= vn)) {
      return (uintb)p_Var3[1]._M_parent;
    }
  }
  UNRECOVERED_JUMPTABLE = (this->super_EmulatePcodeOp).super_Emulate._vptr_Emulate[0x14];
  iVar2 = (*UNRECOVERED_JUMPTABLE)
                    (this,(vn->loc).base,(vn->loc).offset,(ulong)(uint)vn->size,
                     UNRECOVERED_JUMPTABLE);
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

bool isInput(void) const { return ((flags&Varnode::input)!=0); }